

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath * __thiscall testing::internal::FilePath::RemoveDirectoryName(FilePath *this)

{
  char *pcVar1;
  string *in_RDI;
  char *last_sep;
  FilePath *in_stack_ffffffffffffff88;
  FilePath *in_stack_ffffffffffffff90;
  allocator *paVar2;
  string *this_00;
  allocator local_39;
  string local_38 [32];
  char *local_18;
  
  this_00 = in_RDI;
  local_18 = FindLastPathSeparator(in_stack_ffffffffffffff90);
  if (local_18 == (char *)0x0) {
    FilePath(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  else {
    pcVar1 = local_18 + 1;
    paVar2 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,paVar2);
    FilePath((FilePath *)this_00,in_RDI);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return (FilePath *)this_00;
}

Assistant:

FilePath FilePath::RemoveDirectoryName() const {
  const char* const last_sep = FindLastPathSeparator();
  return last_sep ? FilePath(last_sep + 1) : *this;
}